

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

void __thiscall Matrix4f::setSubmatrix2x2(Matrix4f *this,int i0,int j0,Matrix2f *m)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  Matrix2f *m_local;
  int j0_local;
  int i0_local;
  Matrix4f *this_local;
  
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      pfVar2 = Matrix2f::operator()(m,local_24,local_28);
      fVar1 = *pfVar2;
      pfVar2 = operator()(this,local_24 + i0,local_28 + j0);
      *pfVar2 = fVar1;
    }
  }
  return;
}

Assistant:

void Matrix4f::setSubmatrix2x2( int i0, int j0, const Matrix2f& m )
{
	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			( *this )( i + i0, j + j0 ) = m( i, j );
		}
	}
}